

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O3

void TestConstExpr::ComparisonTestTU<char,short>(void)

{
  if (ComparisonTestTU<char,short>()::b1 == '\0') {
    ComparisonTestTU<char,short>();
  }
  if (ComparisonTestTU<char,short>()::b2 == '\0') {
    ComparisonTestTU<char,short>();
  }
  if (ComparisonTestTU<char,short>()::b3 == '\0') {
    ComparisonTestTU<char,short>();
  }
  if (ComparisonTestTU<char,short>()::b4 == '\0') {
    ComparisonTestTU<char,short>();
  }
  if (ComparisonTestTU<char,short>()::b5 == '\0') {
    ComparisonTestTU<char,short>();
  }
  if (ComparisonTestTU<char,short>()::b6 == '\0') {
    ComparisonTestTU<char,short>();
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}